

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring.cpp
# Opt level: O1

void duckdb::BitStringFunction<false>(DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  value_type vVar2;
  value_type vVar3;
  int iVar4;
  anon_union_16_2_67f50693_for_value *paVar5;
  long lVar6;
  int *piVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar8;
  undefined8 uVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  reference vector;
  reference vector_00;
  UnifiedVectorFormat *pUVar11;
  TemplatedValidityData<unsigned_long> *pTVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  VectorType VVar17;
  ValidityMask *in_R8;
  idx_t in_R9;
  idx_t idx_in_entry;
  UnifiedVectorFormat *pUVar18;
  UnifiedVectorFormat *pUVar19;
  ulong uVar20;
  undefined8 *puVar21;
  UnifiedVectorFormat *pUVar22;
  long lVar23;
  ulong uVar24;
  string_t left;
  string_t left_00;
  string_t left_01;
  string_t left_02;
  string_t left_03;
  string_t left_04;
  string_t left_05;
  anon_struct_16_3_d7536bce_for_pointer aVar25;
  string_t sVar26;
  UnifiedVectorFormat ldata;
  undefined8 local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d0;
  unsigned_long local_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78;
  long local_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  vector = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,1);
  vVar2 = *vector;
  vVar3 = *vector_00;
  VVar17 = (VectorType)result;
  if (((byte)vVar2 ^ 2) == 0 && ((byte)vVar3 ^ 2) == 0) {
    duckdb::Vector::SetVectorType(VVar17);
    paVar5 = *(anon_union_16_2_67f50693_for_value **)(result + 0x20);
    if (((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) &&
       ((*(byte **)(vector_00 + 0x28) == (byte *)0x0 || ((**(byte **)(vector_00 + 0x28) & 1) != 0)))
       ) {
      aVar25 = (anon_struct_16_3_d7536bce_for_pointer)
               BinaryLambdaWrapper::
               Operation<duckdb::BitStringFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                         ((anon_class_8_1_6971b95b)result,
                          (string_t)
                          (*(anon_union_16_2_67f50693_for_value **)(vector + 0x20))->pointer,
                          **(int **)(vector_00 + 0x20),in_R8,in_R9);
      paVar5->pointer = aVar25;
      return;
    }
  }
  else {
    pUVar22 = *(UnifiedVectorFormat **)(args + 0x18);
    if (((byte)vVar3 ^ 2) == 0 && vVar2 == (value_type)0x0) {
      lVar6 = *(long *)(vector + 0x20);
      piVar7 = *(int **)(vector_00 + 0x20);
      if ((*(byte **)(vector_00 + 0x28) == (byte *)0x0) ||
         ((**(byte **)(vector_00 + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar17);
        lVar16 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        *(undefined8 *)(result + 0x28) = *(undefined8 *)(vector + 0x28);
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30)
                   ,(shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                    (vector + 0x30));
        *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector + 0x40);
        if (*(long *)(result + 0x28) == 0) {
          if (pUVar22 == (UnifiedVectorFormat *)0x0) {
            return;
          }
          iVar4 = *piVar7;
          lVar15 = 8;
          do {
            left_02.value.pointer.ptr = (char *)*(undefined8 *)(lVar6 + lVar15);
            left_02.value._0_8_ = *(undefined8 *)(lVar6 + -8 + lVar15);
            sVar26 = BinaryLambdaWrapper::
                     Operation<duckdb::BitStringFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                               ((anon_class_8_1_6971b95b)result,left_02,iVar4,in_R8,in_R9);
            *(long *)(lVar16 + -8 + lVar15) = sVar26.value._0_8_;
            *(long *)(lVar16 + lVar15) = sVar26.value._8_8_;
            lVar15 = lVar15 + 0x10;
            pUVar22 = pUVar22 + -1;
          } while (pUVar22 != (UnifiedVectorFormat *)0x0);
          return;
        }
        if (pUVar22 + 0x3f < (UnifiedVectorFormat *)0x40) {
          return;
        }
        uVar13 = 0;
        pUVar18 = (UnifiedVectorFormat *)0x0;
        do {
          if (*(long *)(result + 0x28) == 0) {
            uVar20 = 0xffffffffffffffff;
          }
          else {
            uVar20 = *(ulong *)(*(long *)(result + 0x28) + uVar13 * 8);
          }
          pUVar11 = pUVar18 + 0x40;
          if (pUVar22 <= pUVar18 + 0x40) {
            pUVar11 = pUVar22;
          }
          pUVar19 = pUVar11;
          if (uVar20 != 0) {
            pUVar19 = pUVar18;
            if (uVar20 == 0xffffffffffffffff) {
              if (pUVar18 < pUVar11) {
                iVar4 = *piVar7;
                uVar20 = (long)pUVar18 << 4 | 8;
                do {
                  left.value.pointer.ptr = (char *)*(undefined8 *)(lVar6 + uVar20);
                  left.value._0_8_ = *(undefined8 *)(lVar6 + -8 + uVar20);
                  sVar26 = BinaryLambdaWrapper::
                           Operation<duckdb::BitStringFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                     ((anon_class_8_1_6971b95b)result,left,iVar4,in_R8,in_R9);
                  *(long *)(lVar16 + -8 + uVar20) = sVar26.value._0_8_;
                  *(long *)(lVar16 + uVar20) = sVar26.value._8_8_;
                  pUVar18 = pUVar18 + 1;
                  uVar20 = uVar20 + 0x10;
                  pUVar19 = pUVar18;
                } while (pUVar11 != pUVar18);
              }
            }
            else if (pUVar18 < pUVar11) {
              uVar14 = (long)pUVar18 << 4 | 8;
              uVar24 = 0;
              do {
                if ((uVar20 >> (uVar24 & 0x3f) & 1) != 0) {
                  left_00.value.pointer.ptr = (char *)*(undefined8 *)(lVar6 + uVar14);
                  left_00.value._0_8_ = *(undefined8 *)(lVar6 + -8 + uVar14);
                  sVar26 = BinaryLambdaWrapper::
                           Operation<duckdb::BitStringFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                     ((anon_class_8_1_6971b95b)result,left_00,*piVar7,in_R8,in_R9);
                  *(long *)(lVar16 + -8 + uVar14) = sVar26.value._0_8_;
                  *(long *)(lVar16 + uVar14) = sVar26.value._8_8_;
                }
                uVar24 = uVar24 + 1;
                uVar14 = uVar14 + 0x10;
              } while (pUVar18 + (uVar24 - (long)pUVar11) != (UnifiedVectorFormat *)0x0);
              pUVar19 = pUVar18 + uVar24;
            }
          }
          uVar13 = uVar13 + 1;
          pUVar18 = pUVar19;
        } while (uVar13 != (ulong)(pUVar22 + 0x3f) >> 6);
        return;
      }
    }
    else {
      if (((byte)vVar2 ^ 2) != 0 || vVar3 != (value_type)0x0) {
        if (vVar3 == (value_type)0x0 && vVar2 == (value_type)0x0) {
          lVar6 = *(long *)(vector + 0x20);
          lVar16 = *(long *)(vector_00 + 0x20);
          duckdb::Vector::SetVectorType(VVar17);
          lVar15 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::VerifyFlatVector(result);
          *(undefined8 *)(result + 0x28) = *(undefined8 *)(vector + 0x28);
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                     (result + 0x30),
                     (shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                     (vector + 0x30));
          *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector + 0x40);
          FlatVector::VerifyFlatVector(vector_00);
          duckdb::ValidityMask::Combine((ValidityMask *)(result + 0x28),(ulong)(vector_00 + 0x28));
          if (*(long *)(result + 0x28) == 0) {
            if (pUVar22 != (UnifiedVectorFormat *)0x0) {
              lVar23 = 0;
              do {
                sVar26.value.pointer.ptr = (char *)*(undefined8 *)(lVar6 + 8 + lVar23 * 4);
                sVar26.value._0_8_ = *(undefined8 *)(lVar6 + lVar23 * 4);
                sVar26 = BinaryLambdaWrapper::
                         Operation<duckdb::BitStringFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,sVar26,*(int *)(lVar16 + lVar23)
                                    ,in_R8,in_R9);
                *(long *)(lVar15 + lVar23 * 4) = sVar26.value._0_8_;
                *(long *)(lVar15 + 8 + lVar23 * 4) = sVar26.value._8_8_;
                lVar23 = lVar23 + 4;
                pUVar22 = pUVar22 + -1;
              } while (pUVar22 != (UnifiedVectorFormat *)0x0);
            }
          }
          else if ((UnifiedVectorFormat *)0x3f < pUVar22 + 0x3f) {
            uVar13 = 0;
            pUVar18 = (UnifiedVectorFormat *)0x0;
            do {
              lVar23 = *(long *)(result + 0x28);
              if (lVar23 == 0) {
                uVar20 = 0xffffffffffffffff;
              }
              else {
                uVar20 = *(ulong *)(lVar23 + uVar13 * 8);
              }
              pUVar11 = pUVar18 + 0x40;
              if (pUVar22 <= pUVar18 + 0x40) {
                pUVar11 = pUVar22;
              }
              pUVar19 = pUVar11;
              if (uVar20 != 0) {
                pUVar19 = pUVar18;
                if (uVar20 == 0xffffffffffffffff) {
                  if (pUVar18 < pUVar11) {
                    lVar23 = (long)pUVar18 * 4 + 2;
                    do {
                      left_03.value.pointer.ptr = (char *)*(undefined8 *)(lVar6 + lVar23 * 4);
                      left_03.value._0_8_ = *(undefined8 *)(lVar6 + -8 + lVar23 * 4);
                      sVar26 = BinaryLambdaWrapper::
                               Operation<duckdb::BitStringFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                         ((anon_class_8_1_6971b95b)result,left_03,
                                          *(int *)(lVar16 + (long)pUVar18 * 4),in_R8,in_R9);
                      *(long *)(lVar15 + -8 + lVar23 * 4) = sVar26.value._0_8_;
                      *(long *)(lVar15 + lVar23 * 4) = sVar26.value._8_8_;
                      pUVar18 = pUVar18 + 1;
                      lVar23 = lVar23 + 4;
                      pUVar19 = pUVar18;
                    } while (pUVar11 != pUVar18);
                  }
                }
                else if (pUVar18 < pUVar11) {
                  lVar23 = (long)pUVar18 * 4 + 2;
                  uVar14 = 0;
                  do {
                    if ((uVar20 >> (uVar14 & 0x3f) & 1) != 0) {
                      left_04.value.pointer.ptr = (char *)*(undefined8 *)(lVar6 + lVar23 * 4);
                      left_04.value._0_8_ = *(undefined8 *)(lVar6 + -8 + lVar23 * 4);
                      sVar26 = BinaryLambdaWrapper::
                               Operation<duckdb::BitStringFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                         ((anon_class_8_1_6971b95b)result,left_04,
                                          *(int *)(lVar16 + (long)pUVar18 * 4 + uVar14 * 4),in_R8,
                                          in_R9);
                      *(long *)(lVar15 + -8 + lVar23 * 4) = sVar26.value._0_8_;
                      *(long *)(lVar15 + lVar23 * 4) = sVar26.value._8_8_;
                    }
                    uVar14 = uVar14 + 1;
                    lVar23 = lVar23 + 4;
                  } while (pUVar18 + (uVar14 - (long)pUVar11) != (UnifiedVectorFormat *)0x0);
                  pUVar19 = pUVar18 + uVar14;
                }
              }
              uVar13 = uVar13 + 1;
              pUVar18 = pUVar19;
            } while (uVar13 != (ulong)(pUVar22 + 0x3f) >> 6);
          }
        }
        else {
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
          duckdb::Vector::ToUnifiedFormat((ulong)vector,pUVar22);
          duckdb::Vector::ToUnifiedFormat((ulong)vector_00,pUVar22);
          duckdb::Vector::SetVectorType(VVar17);
          lVar6 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          if (local_b0 == 0 && local_68 == 0) {
            if (pUVar22 != (UnifiedVectorFormat *)0x0) {
              lVar16 = *local_78;
              lVar15 = *local_c0;
              puVar21 = (undefined8 *)(lVar6 + 8);
              pUVar18 = (UnifiedVectorFormat *)0x0;
              do {
                pUVar11 = pUVar18;
                if (lVar16 != 0) {
                  pUVar11 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar16 + (long)pUVar18 * 4);
                }
                pUVar19 = pUVar18;
                if (lVar15 != 0) {
                  pUVar19 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar15 + (long)pUVar18 * 4);
                }
                left_01.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_70 + 8 + (long)pUVar11 * 0x10);
                left_01.value._0_8_ = *(undefined8 *)(local_70 + (long)pUVar11 * 0x10);
                sVar26 = BinaryLambdaWrapper::
                         Operation<duckdb::BitStringFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,left_01,
                                    *(int *)(local_b8 + (long)pUVar19 * 4),in_R8,in_R9);
                puVar21[-1] = sVar26.value._0_8_;
                *puVar21 = sVar26.value._8_8_;
                pUVar18 = pUVar18 + 1;
                puVar21 = puVar21 + 2;
              } while (pUVar22 != pUVar18);
            }
          }
          else if (pUVar22 != (UnifiedVectorFormat *)0x0) {
            lVar16 = *local_78;
            lVar15 = *local_c0;
            puVar21 = (undefined8 *)(lVar6 + 8);
            pUVar18 = (UnifiedVectorFormat *)0x0;
            do {
              pUVar11 = pUVar18;
              if (lVar16 != 0) {
                pUVar11 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar16 + (long)pUVar18 * 4);
              }
              pUVar19 = pUVar18;
              if (lVar15 != 0) {
                pUVar19 = (UnifiedVectorFormat *)(ulong)*(uint *)(lVar15 + (long)pUVar18 * 4);
              }
              if (((local_68 == 0) ||
                  ((*(ulong *)(local_68 + ((ulong)pUVar11 >> 6) * 8) >> ((ulong)pUVar11 & 0x3f) & 1)
                   != 0)) &&
                 ((local_b0 == 0 ||
                  ((*(ulong *)(local_b0 + ((ulong)pUVar19 >> 6) * 8) >> ((ulong)pUVar19 & 0x3f) & 1)
                   != 0)))) {
                left_05.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_70 + 8 + (long)pUVar11 * 0x10);
                left_05.value._0_8_ = *(undefined8 *)(local_70 + (long)pUVar11 * 0x10);
                sVar26 = BinaryLambdaWrapper::
                         Operation<duckdb::BitStringFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,left_05,
                                    *(int *)(local_b8 + (long)pUVar19 * 4),in_R8,in_R9);
                puVar21[-1] = sVar26.value._0_8_;
                *puVar21 = sVar26.value._8_8_;
              }
              else {
                if (*(long *)(result + 0x28) == 0) {
                  local_c8 = *(unsigned_long *)(result + 0x40);
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_d8,&local_c8);
                  p_Var10 = p_Stack_d0;
                  uVar9 = local_d8;
                  local_d8 = 0;
                  p_Stack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
                  *(undefined8 *)(result + 0x30) = uVar9;
                  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var10;
                  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
                  }
                  if (p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
                  }
                  pTVar12 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                        *)(result + 0x30));
                  *(unsigned_long **)(result + 0x28) =
                       (pTVar12->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
                }
                bVar8 = (byte)pUVar18 & 0x3f;
                puVar1 = (ulong *)(*(long *)(result + 0x28) + ((ulong)pUVar18 >> 6) * 8);
                *puVar1 = *puVar1 & (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
              }
              pUVar18 = pUVar18 + 1;
              puVar21 = puVar21 + 2;
            } while (pUVar22 != pUVar18);
          }
          if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
          }
          if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
          }
          if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
          }
          if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
          }
        }
        return;
      }
      paVar5 = *(anon_union_16_2_67f50693_for_value **)(vector + 0x20);
      lVar6 = *(long *)(vector_00 + 0x20);
      if ((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar17);
        lVar16 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::VerifyFlatVector(result);
        *(undefined8 *)(result + 0x28) = *(undefined8 *)(vector_00 + 0x28);
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(result + 0x30)
                   ,(shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                    (vector_00 + 0x30));
        *(undefined8 *)(result + 0x40) = *(undefined8 *)(vector_00 + 0x40);
        if (*(long *)(result + 0x28) == 0) {
          if (pUVar22 == (UnifiedVectorFormat *)0x0) {
            return;
          }
          aVar25 = paVar5->pointer;
          puVar21 = (undefined8 *)(lVar16 + 8);
          pUVar18 = (UnifiedVectorFormat *)0x0;
          do {
            sVar26 = BinaryLambdaWrapper::
                     Operation<duckdb::BitStringFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                               ((anon_class_8_1_6971b95b)result,(string_t)aVar25,
                                *(int *)(lVar6 + (long)pUVar18 * 4),in_R8,in_R9);
            puVar21[-1] = sVar26.value._0_8_;
            *puVar21 = sVar26.value._8_8_;
            pUVar18 = pUVar18 + 1;
            puVar21 = puVar21 + 2;
          } while (pUVar22 != pUVar18);
          return;
        }
        if (pUVar22 + 0x3f < (UnifiedVectorFormat *)0x40) {
          return;
        }
        lVar16 = lVar16 + 8;
        uVar13 = 0;
        pUVar18 = (UnifiedVectorFormat *)0x0;
        do {
          if (*(long *)(result + 0x28) == 0) {
            uVar20 = 0xffffffffffffffff;
          }
          else {
            uVar20 = *(ulong *)(*(long *)(result + 0x28) + uVar13 * 8);
          }
          pUVar11 = pUVar18 + 0x40;
          if (pUVar22 <= pUVar18 + 0x40) {
            pUVar11 = pUVar22;
          }
          pUVar19 = pUVar11;
          if (uVar20 != 0) {
            pUVar19 = pUVar18;
            if (uVar20 == 0xffffffffffffffff) {
              if (pUVar18 < pUVar11) {
                aVar25 = paVar5->pointer;
                puVar21 = (undefined8 *)((long)pUVar18 * 0x10 + lVar16);
                do {
                  sVar26 = BinaryLambdaWrapper::
                           Operation<duckdb::BitStringFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                     ((anon_class_8_1_6971b95b)result,(string_t)aVar25,
                                      *(int *)(lVar6 + (long)pUVar19 * 4),in_R8,in_R9);
                  puVar21[-1] = sVar26.value._0_8_;
                  *puVar21 = sVar26.value._8_8_;
                  pUVar19 = pUVar19 + 1;
                  puVar21 = puVar21 + 2;
                } while (pUVar11 != pUVar19);
              }
            }
            else if (pUVar18 < pUVar11) {
              puVar21 = (undefined8 *)((long)pUVar18 * 0x10 + lVar16);
              uVar14 = 0;
              do {
                if ((uVar20 >> (uVar14 & 0x3f) & 1) != 0) {
                  sVar26 = BinaryLambdaWrapper::
                           Operation<duckdb::BitStringFunction<false>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,int)_1_,bool,duckdb::string_t,int,duckdb::string_t>
                                     ((anon_class_8_1_6971b95b)result,(string_t)paVar5->pointer,
                                      *(int *)(lVar6 + (long)pUVar18 * 4 + uVar14 * 4),in_R8,in_R9);
                  puVar21[-1] = sVar26.value._0_8_;
                  *puVar21 = sVar26.value._8_8_;
                }
                uVar14 = uVar14 + 1;
                puVar21 = puVar21 + 2;
              } while (pUVar18 + (uVar14 - (long)pUVar11) != (UnifiedVectorFormat *)0x0);
              pUVar19 = pUVar18 + uVar14;
            }
          }
          uVar13 = uVar13 + 1;
          pUVar18 = pUVar19;
        } while (uVar13 != (ulong)(pUVar22 + 0x3f) >> 6);
        return;
      }
    }
    duckdb::Vector::SetVectorType(VVar17);
  }
  duckdb::ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void BitStringFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	BinaryExecutor::Execute<string_t, int32_t, string_t>(
	    args.data[0], args.data[1], result, args.size(), [&](string_t input, int32_t n) {
		    if (n < 0) {
			    throw InvalidInputException("The bitstring length cannot be negative");
		    }
		    idx_t input_length;
		    if (FROM_STRING) {
			    input_length = input.GetSize();
		    } else {
			    input_length = Bit::BitLength(input);
		    }
		    if (idx_t(n) < input_length) {
			    throw InvalidInputException("Length must be equal or larger than input string");
		    }
		    idx_t len;
		    if (FROM_STRING) {
			    Bit::TryGetBitStringSize(input, len, nullptr); // string verification
		    }

		    len = Bit::ComputeBitstringLen(UnsafeNumericCast<idx_t>(n));
		    string_t target = StringVector::EmptyString(result, len);
		    if (FROM_STRING) {
			    Bit::BitString(input, UnsafeNumericCast<idx_t>(n), target);
		    } else {
			    Bit::ExtendBitString(input, UnsafeNumericCast<idx_t>(n), target);
		    }
		    target.Finalize();
		    return target;
	    });
}